

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O0

void __thiscall
absl::lts_20250127::base_internal::
AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
operator()(AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
           *this,LogSeverity *args,char **args_1,int *args_2,char (*args_3) [38])

{
  LogSeverity LVar1;
  int iVar2;
  char *pcVar3;
  char (*__s) [38];
  FnPtr p_Var4;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char (*local_30) [38];
  char (*args_local_3) [38];
  int *args_local_2;
  char **args_local_1;
  LogSeverity *args_local;
  AtomicHook<void_(*)(absl::lts_20250127::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_30 = args_3;
  args_local_3 = (char (*) [38])args_2;
  args_local_2 = (int *)args_1;
  args_local_1 = (char **)args;
  args_local = (LogSeverity *)this;
  p_Var4 = AtomicHook<void_(*)(absl::lts_20250127::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::DoLoad((AtomicHook<void_(*)(absl::lts_20250127::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)this);
  __s = local_30;
  LVar1 = *(LogSeverity *)args_local_1;
  pcVar3 = *(char **)args_local_2;
  iVar2 = *(int *)*args_local_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*__s,&local_51);
  (*p_Var4)(LVar1,pcVar3,iVar2,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

ReturnType operator()(CallArgs&&... args) const {
    return DoLoad()(std::forward<CallArgs>(args)...);
  }